

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

void __thiscall IlmThread_2_5::TaskGroup::Data::addTask(Data *this)

{
  int iVar1;
  void *in_RSI;
  
  LOCK();
  iVar1 = (this->numPending).super___atomic_base<int>._M_i;
  (this->numPending).super___atomic_base<int>._M_i =
       (this->numPending).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (iVar1 != 0) {
    return;
  }
  Semaphore::wait(&this->isEmpty,in_RSI);
  return;
}

Assistant:

void
TaskGroup::Data::addTask () 
{
    //
    // in c++11, we use an atomic to protect numPending to avoid the
    // extra lock but for c++98, to add the ability for custom thread
    // pool we add the lock here
    //
#ifdef ILMBASE_FORCE_CXX03
    Lock lock (dtorMutex);
#endif
    if (numPending++ == 0)
        isEmpty.wait ();
}